

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               EnumValidityFunc *is_valid)

{
  LogMessage *other;
  undefined1 local_98 [8];
  ExtensionInfo info;
  LogMessage local_58;
  EnumValidityFuncWithArg *local_20;
  EnumValidityFunc *is_valid_local;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *extendee_local;
  
  local_20 = (EnumValidityFuncWithArg *)is_valid;
  is_valid_local._1_1_ = is_packed;
  is_valid_local._2_1_ = is_repeated;
  is_valid_local._3_1_ = type;
  is_valid_local._4_4_ = number;
  pMStack_10 = extendee;
  if (type != '\x0e') {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0xb4);
    other = LogMessage::operator<<
                      (&local_58,"CHECK failed: (type) == (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=((LogFinisher *)((long)&info.descriptor + 3),other);
    LogMessage::~LogMessage(&local_58);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_98,pMStack_10,is_valid_local._4_4_,is_valid_local._3_1_,
             (bool)(is_valid_local._2_1_ & 1),(bool)(is_valid_local._1_1_ & 1));
  info._8_8_ = CallNoArgValidityFunc;
  info.field_5.enum_validity_check.func = local_20;
  anon_unknown_22::Register((ExtensionInfo *)local_98);
  return;
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* extendee,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         EnumValidityFunc* is_valid) {
  GOOGLE_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.enum_validity_check.func = CallNoArgValidityFunc;
  // See comment in CallNoArgValidityFunc() about why we use a c-style cast.
  info.enum_validity_check.arg = (void*)is_valid;
  Register(info);
}